

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O0

void __thiscall CNNTest_TestMultiOutput_Test::TestBody(CNNTest_TestMultiOutput_Test *this)

{
  bool bVar1;
  CNN_MULTI_OUT output_struct;
  int channel;
  int output_idx;
  float *output_ite;
  int ch_ite;
  float *output [256];
  AssertionResult gtest_ar;
  float *output_;
  int output_sizes [4];
  int output_dims [4];
  int output_chs [4];
  int num_outputs;
  CNN_THREAD_DATA thread_data;
  CNN_CONFIG cnn_config;
  float *expected [4];
  float expected_3 [4];
  float expected_2 [2];
  float expected_1 [8];
  float expected_0 [32];
  float weights_4 [64];
  float weights_3 [16];
  float weights_2 [16];
  float weights_1 [24];
  float bias [2];
  float *input [3];
  float input_ [192];
  int num_filters;
  int stride;
  int filter_dim;
  int image_ch;
  int image_dim;
  AssertHelper *in_stack_ffffffffffffd250;
  undefined1 **ppuVar2;
  float **in_stack_ffffffffffffd258;
  AssertionResult *this_00;
  undefined4 in_stack_ffffffffffffd268;
  undefined4 in_stack_ffffffffffffd26c;
  int line;
  undefined1 **file;
  Type type;
  undefined4 in_stack_ffffffffffffd280;
  undefined4 in_stack_ffffffffffffd284;
  int local_2d60;
  int local_2d5c;
  void *local_2d58;
  int local_2d4c;
  undefined8 local_2d48 [2];
  Message *in_stack_ffffffffffffd2c8;
  AssertHelper *in_stack_ffffffffffffd2d0;
  double in_stack_ffffffffffffd468;
  CNN_THREAD_DATA *in_stack_ffffffffffffd470;
  CNN_CONFIG *in_stack_ffffffffffffd478;
  int in_stack_ffffffffffffd484;
  int in_stack_ffffffffffffd488;
  int in_stack_ffffffffffffd48c;
  float **in_stack_ffffffffffffd490;
  CNN_MULTI_OUT *in_stack_ffffffffffffd4a0;
  float **in_stack_ffffffffffffd4a8;
  AssertionResult local_2510;
  void *local_2500;
  undefined8 local_24f8;
  undefined8 uStack_24f0;
  int local_24e8 [11];
  undefined4 local_24bc;
  undefined8 local_24b8;
  undefined8 uStack_24b0;
  undefined4 local_24a8 [6];
  undefined4 local_2490;
  undefined4 local_248c;
  undefined4 local_2488;
  undefined4 local_2484;
  undefined4 local_2480;
  undefined4 local_247c;
  undefined1 *local_2470;
  undefined1 *local_2468;
  undefined1 local_2460;
  undefined1 local_245f;
  undefined1 local_2454;
  undefined1 local_2453;
  undefined4 local_2450;
  undefined4 local_2418;
  undefined4 local_2414;
  undefined4 local_2410;
  undefined4 local_240c;
  undefined4 local_2408;
  undefined4 local_2404;
  undefined1 *local_23f8;
  undefined1 *local_23f0;
  undefined1 local_23e8;
  undefined1 local_23e7;
  undefined1 local_23dc;
  undefined1 local_23db;
  undefined4 local_23a8;
  undefined4 local_23a0;
  undefined4 local_239c;
  undefined4 local_2398;
  undefined4 local_2394;
  undefined4 local_2390;
  undefined4 local_238c;
  undefined1 *local_2380;
  undefined1 *local_2378;
  undefined1 local_2370;
  undefined1 local_236f;
  undefined1 local_2364;
  undefined1 local_2363;
  undefined4 local_2330;
  undefined4 local_2328;
  undefined4 local_2324;
  undefined4 local_2320;
  undefined4 local_231c;
  undefined4 local_2318;
  undefined4 local_2314;
  undefined1 *local_2308;
  undefined1 *local_2300;
  undefined1 local_22f8;
  undefined1 local_22f7;
  undefined4 local_22f0;
  undefined1 local_22ec;
  undefined1 local_22eb;
  undefined4 local_22e0;
  undefined4 local_22b8;
  undefined1 *apuStack_22b0 [915];
  undefined1 *local_618;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 local_5f8;
  undefined8 local_5f0;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined1 local_5b8 [128];
  undefined1 local_538 [256];
  undefined1 local_438 [64];
  undefined1 local_3f8 [64];
  undefined1 local_3b8 [104];
  undefined1 local_350 [8];
  undefined1 *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  undefined1 local_328 [256];
  undefined1 auStack_228 [256];
  undefined1 auStack_128 [268];
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 8;
  local_10 = 3;
  local_14 = 2;
  local_18 = 2;
  local_1c = 2;
  memcpy(local_328,&DAT_018aa270,0x300);
  local_348 = local_328;
  local_340 = auStack_228;
  local_338 = auStack_128;
  memset(local_350,0,8);
  memcpy(local_3b8,&DAT_018aa570,0x60);
  memcpy(local_3f8,&DAT_018aa5d0,0x40);
  memcpy(local_438,&DAT_018aa610,0x40);
  memcpy(local_538,&DAT_018aa650,0x100);
  memcpy(local_5b8,&DAT_018aa750,0x80);
  local_5d8 = 0;
  local_5d0 = 0;
  local_5c8 = 0x3ea68efa3ecfc38e;
  local_5c0 = 0x3f9c2d5f00000000;
  local_5e0 = 0x3f04735d3e1fddc7;
  local_5f8 = 0x3f00ddcd3e658ee1;
  local_5f0 = 0x3f04735d3e1fddc7;
  local_618 = local_5b8;
  local_610 = &local_5d8;
  local_608 = &local_5e0;
  local_600 = &local_5f8;
  memset(local_24a8,0,0x1e90);
  local_24a8[0] = 4;
  local_2490 = 3;
  local_248c = 2;
  local_2488 = 2;
  local_2484 = 2;
  local_2480 = 2;
  local_247c = 2;
  local_2470 = local_3b8;
  local_2468 = local_350;
  local_2460 = 0;
  local_245f = 0;
  local_2454 = 2;
  local_2453 = 0;
  local_2450 = 2;
  local_2418 = 2;
  local_2414 = 2;
  local_2410 = 2;
  local_240c = 2;
  local_2408 = 2;
  local_2404 = 2;
  local_23f8 = local_3f8;
  local_23f0 = local_350;
  local_23e8 = 0;
  local_23e7 = 1;
  local_23dc = 0;
  local_23db = 0;
  local_23a8 = 1;
  local_23a0 = 2;
  local_239c = 2;
  local_2398 = 2;
  local_2394 = 2;
  local_2390 = 2;
  local_238c = 2;
  local_2380 = local_438;
  local_2378 = local_350;
  local_2370 = 0;
  local_236f = 1;
  local_2364 = 0;
  local_2363 = 0;
  local_2330 = 2;
  local_2328 = 2;
  local_2324 = 4;
  local_2320 = 4;
  local_231c = 2;
  local_2318 = 4;
  local_2314 = 4;
  local_2308 = local_538;
  local_2300 = local_350;
  local_22f8 = 2;
  local_22f7 = 1;
  local_22f0 = 1;
  local_22ec = 0;
  local_22eb = 2;
  local_22e0 = 1;
  local_22b8 = 3;
  ppuVar2 = apuStack_22b0;
  file = &local_618;
  do {
    ppuVar2 = ppuVar2 + 0xf;
  } while (ppuVar2 != file);
  local_24b8 = 1;
  uStack_24b0 = 0;
  local_24bc = 4;
  local_24e8[4] = 2;
  local_24e8[5] = 2;
  local_24e8[6] = 2;
  local_24e8[7] = 4;
  local_24e8[0] = 4;
  local_24e8[1] = 2;
  local_24e8[2] = 1;
  local_24e8[3] = 1;
  local_24f8 = 0x800000020;
  uStack_24f0 = 0x400000002;
  local_2500 = aom_malloc(0x4ea8b1);
  type = (Type)((ulong)ppuVar2 >> 0x20);
  this_00 = &local_2510;
  testing::internal::CmpHelperNE<float*,decltype(nullptr)>
            ((char *)CONCAT44(in_stack_ffffffffffffd26c,in_stack_ffffffffffffd268),
             &this_00->success_,in_stack_ffffffffffffd258,&in_stack_ffffffffffffd250->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  line = CONCAT13(bVar1,(int3)in_stack_ffffffffffffd26c);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_ffffffffffffd284,in_stack_ffffffffffffd280));
    testing::AssertionResult::failure_message((AssertionResult *)0x4ea949);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffd284,in_stack_ffffffffffffd280),type,
               (char *)file,line,&this_00->success_);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffd2d0,in_stack_ffffffffffffd2c8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffd250);
    testing::Message::~Message((Message *)0x4ea9a6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x4eaa14);
  if (bVar1) {
    memset(local_2d48,0,0x800);
    local_2d4c = 0;
    local_2d58 = local_2500;
    for (local_2d5c = 0; local_2d5c < 4; local_2d5c = local_2d5c + 1) {
      for (local_2d60 = 0; local_2d60 < local_24e8[(long)local_2d5c + 4];
          local_2d60 = local_2d60 + 1) {
        local_2d48[local_2d4c] = local_2d58;
        local_2d58 = (void *)((long)local_2d58 +
                             (long)(local_24e8[local_2d5c] * local_24e8[local_2d5c]) * 4);
        local_2d4c = local_2d4c + 1;
      }
    }
    ppuVar2 = &local_618;
    anon_unknown.dwarf_30f402::CNNTest::RunMultiOutCNNTest
              (in_stack_ffffffffffffd490,in_stack_ffffffffffffd48c,in_stack_ffffffffffffd488,
               in_stack_ffffffffffffd484,in_stack_ffffffffffffd478,in_stack_ffffffffffffd470,
               in_stack_ffffffffffffd4a0,in_stack_ffffffffffffd4a8,in_stack_ffffffffffffd468);
    aom_free(ppuVar2);
  }
  return;
}

Assistant:

TEST_F(CNNTest, TestMultiOutput) {
  const int image_dim = 8;
  const int image_ch = 3;
  const int filter_dim = 2;
  const int stride = 2;
  const int num_filters = 2;

  const float input_[] = {
    1.7537929121f,     0.134331551012f,    0.123580039877f,   0.957731845246f,
    0.391006834217f,   1.00699352042f,     -0.778177955829f,  -0.814166433059f,
    -0.656374394915f,  0.321967305228f,    -2.19455719176f,   0.708035038966f,
    0.409148822266f,   -0.318254408902f,   0.152450211189f,   -0.250210793369f,
    0.826811563186f,   1.6804156584f,      0.273626975978f,   0.437936241887f,
    -0.329935520167f,  -0.288761611645f,   0.156937008304f,   0.271054157295f,
    -0.0224828854332f, 1.70110336895f,     -0.989066699309f,  1.30863131729f,
    -0.165813705702f,  0.00380178619265f,  -0.0837342367587f, 0.760954783156f,
    -0.413610373524f,  1.17968204175f,     0.720295719536f,   0.308718974472f,
    -1.10091337671f,   0.693160033687f,    -0.0202862320697f, 1.0221927503f,
    -1.24521801881f,   -0.478501952308f,   -1.71648619442f,   -0.182571723636f,
    0.339292649504f,   2.0806519131f,      0.967974033444f,   0.175248672328f,
    0.0658124561472f,  0.795504169496f,    0.750592557361f,   -1.46631013249f,
    -1.79052846838f,   -1.03672179515f,    -0.841985521653f,  1.20995011489f,
    0.140859718215f,   -0.651552622661f,   0.451065110806f,   1.1189443693f,
    0.100213260593f,   -0.834076868118f,   -1.28734321611f,   1.22064420095f,
    -0.364143084361f,  0.750961509335f,    -0.888689074553f,  -0.8253547106f,
    -1.21800999027f,   -0.966670603566f,   1.37384014741f,    0.47281264834f,
    -0.420416235531f,  0.520163906493f,    0.501296589423f,   1.53418976951f,
    0.715234751485f,   0.644551588907f,    0.0763504863375f,  -0.0018541943723f,
    0.322853189656f,   -0.795099723224f,   -0.125177096675f,  1.4476577471f,
    -0.585888410088f,  -1.44391754955f,    -0.610543221933f,  -0.221859179799f,
    0.252060200774f,   -0.86287169623f,    -0.0350246229157f, 1.0932311997f,
    0.899464648842f,   -0.468806951704f,   -0.300861137168f,  1.15776414206f,
    1.03268544738f,    -0.171579585622f,   -0.179136557119f,  -0.354091003368f,
    -0.612298249394f,  -1.20237379258f,    1.54604109659f,    0.130664370287f,
    0.885225111868f,   1.0362799581f,      0.980561720868f,   -0.619379186999f,
    -1.33818929924f,   -0.237233737961f,   -1.89335425073f,   0.567821011321f,
    0.862420368465f,   -1.37380916821f,    0.352190056666f,   0.611261516274f,
    0.393237747152f,   0.894686247967f,    0.190405182149f,   0.264872662911f,
    -0.0657009133797f, 0.0580512653493f,   -0.401825294366f,  0.4106081318f,
    0.49484512188f,    -0.0751103149442f,  -1.43243736382f,   1.79855656009f,
    -1.1075351975f,    0.000354882733011f, -0.950716438608f,  1.27129831688f,
    1.00495189838f,    0.110358656713f,    1.08315032822f,    -0.972676676218f,
    -0.0757668962831f, 1.88932045165f,     -0.0672638136275f, 0.425913010161f,
    -0.781540372017f,  0.976000248609f,    0.687218504122f,   1.31374513445f,
    -0.932658930672f,  -1.25339468479f,    0.422071294078f,   -0.24189927912f,
    0.216906604642f,   -1.88720997548f,    1.99252872889f,    0.353943735777f,
    0.737434784132f,   -1.17848645017f,    1.70424254896f,    0.775297112968f,
    -0.516392797501f,  0.398130609129f,    0.737248101457f,   0.166282500886f,
    1.24699015468f,    0.47116183125f,     1.19091180182f,    -0.372695424578f,
    0.219773209389f,   -0.829467838962f,   -0.52533122724f,   1.98707754595f,
    0.553692606972f,   -0.933228902369f,   1.55427751643f,    -1.08813399144f,
    -0.325686682094f,  0.205091443796f,    -1.70381666435f,   0.466465327942f,
    1.73126863447f,    -0.939133672634f,   1.48318077459f,    -0.599414038168f,
    -1.1583078687f,    0.518116190201f,    0.133571482458f,   0.84958342672f,
    1.02205000597f,    -0.0772082009087f,  -1.69567503859f,   1.4697939436f,
    1.67813743122f,    -0.627911582938f,   0.131380509137f,   -1.35717850726f,
  };
  const float *input[3] = { input_, &input_[image_dim * image_dim],
                            &input_[2 * image_dim * image_dim] };

  const float bias[] = { 0.0f, 0.0f };

  const float weights_1[] = {
    -0.489547413618f, 0.141916424749f,  -0.279286485585f,  -0.115322211094f,
    0.299572786936f,  0.205289980785f,  -0.536254480088f,  -0.253626313744f,
    -0.422883815849f, -0.169702966298f, -0.540104704793f,  0.495319646763f,
    0.298799079422f,  -0.10054550901f,  -0.306085047056f,  0.171061886165f,
    -0.108058703878f, -0.410734629888f, -0.0640674673049f, -0.386524840979f,
    -0.157203423678f, -0.362138920529f, -0.216206085209f,  0.147502517971f,
  };

  const float weights_2[] = {
    0.207580604357f,  0.480821146263f,  -0.29111909562f,   0.47422567493f,
    0.206892553253f,  -0.235067084092f, 0.354516800602f,   -0.212399370252f,
    -0.419071343731f, -0.050350731631f, -0.0516457320279f, -0.0359310500731f,
    0.567044864811f,  -0.060341127522f, 0.0501464839637f,  -0.437785677916f,
  };

  const float weights_3[] = {
    -0.0690452401448f, -0.356657338763f,   -0.219464031809f, 0.551288365843f,
    0.181372090853f,   -0.00245268542109f, 0.409000696276f,  -0.593209108763f,
    0.587352566749f,   -0.243720660227f,   0.266232713887f,  -0.00439285245097f,
    0.252883228305f,   0.152646192631f,    0.0918944932026f, 0.398853715057f,
  };

  const float weights_4[] = {
    0.207560791573f,   0.194201350401f,   0.227802322443f,  0.206533663345f,
    0.0557331066805f,  0.0224159800424f,  -0.143939197467f, -0.27703361602f,
    0.130643888389f,   -0.269456557461f,  0.186242862864f,  -0.162879944774f,
    -0.145503996718f,  -0.0768822987581f, -0.203127976359f, -0.238119922873f,
    -0.258806479994f,  0.0357957680385f,  -0.1027606976f,   -0.287920082345f,
    0.189047820993f,   0.250711538481f,   -0.272815714175f, -0.0431449742024f,
    0.207261230996f,   -0.0396472677451f, 0.131236557412f,  0.174291832499f,
    -0.251515885765f,  -0.107164007499f,  0.185824534748f,  -0.00561585838161f,
    0.273393799578f,   -0.139563699075f,  -0.263922456031f, -0.118859844081f,
    0.109230982597f,   -0.170170294794f,  0.0123025648515f, -0.0839368964355f,
    -0.0774058234297f, 0.255847138286f,   -0.208430879637f, 0.279170114319f,
    -0.272890330712f,  -0.217725903006f,  -0.295923275459f, -0.17008723953f,
    -0.284281803405f,  0.281406323629f,   0.266910044663f,  -0.209963914338f,
    0.271980962964f,   0.142013581699f,   -0.143896509026f, -0.290509242975f,
    -0.305768180935f,  0.196902832117f,   -0.090424189662f, -0.147460802346f,
    0.217722016651f,   0.12353848977f,    -0.169177363577f, -0.0454230918512f,
  };

  const float expected_0[] = {
    -2.04858441055f,  -2.12883075791f,    -0.045177363807f, 0.763949675768f,
    -0.544361512821f, -1.58123168032f,    1.89319847039f,   0.16859080901f,
    -1.16023321135f,  -0.396988107751f,   1.76637090744f,   -1.40434786514f,
    0.908227575669f,  0.817064817605f,    0.215631134908f,  -0.848605613428f,
    -0.106756747018f, 0.0193027166685f,   0.801345615113f,  -0.395407237598f,
    -1.79983795658f,  -1.73054496242f,    0.0584392594454f, -0.388786095569f,
    -0.237269619354f, 0.000843578271263f, -1.24043512104f,  0.487839445893f,
    -0.394259726605f, 0.559632843424f,    -0.527224052291f, -1.53792340282f,
  };

  const float expected_1[] = {
    0.0f, 0.0f,           0.0f, 0.0f, 0.4057888292f, 0.325309571755f,
    0.0f, 1.22013465602f,
  };

  const float expected_2[] = {
    0.156119444687f,
    0.517385299817f,
  };

  const float expected_3[] = {
    0.224177852984f,
    0.503384419034f,
    0.156119444687f,
    0.517385299817f,
  };

  const float *expected[] = { expected_0, expected_1, expected_2, expected_3 };

  CNN_CONFIG cnn_config = {
    4,  // num_layers
    0,  // is_residue
    0,  // ext_width
    0,  // ext_height
    0,  // strict_bounds
    {
        // layer_config
        {
            image_ch,           // in_channels
            filter_dim,         // filter_width
            filter_dim,         // filter_height
            num_filters,        // out_channels
            stride,             // skip_width
            stride,             // skip_height
            0,                  // max_pool
            weights_1,          // weights
            bias,               // bias
            PADDING_SAME_ZERO,  // pad
            NONE,               // activation
            0,                  // deconvolve
            0,                  // branch
            BRANCH_OUTPUT,      // branch_copy_type
            BRANCH_NOC,         // branch_combine_type
            { 2, 0, 0 },        // branch_config
            {},                 // bn_params
            0,                  // output_num
        },
        {
            num_filters,        // in_channels
            filter_dim,         // filter_width
            filter_dim,         // filter_height
            num_filters,        // out_channels
            stride,             // skip_width
            stride,             // skip_height
            0,                  // max_pool
            weights_2,          // weights
            bias,               // bias
            PADDING_SAME_ZERO,  // pad
            RELU,               // activation
            0,                  // deconvolve
            0,                  // branch
            BRANCH_NO_COPY,     // branch_copy_type
            BRANCH_NOC,         // branch_combine_type
            {},                 // branch_config
            {},                 // bn_params
            1,                  // output_num
        },
        {
            num_filters,        // in_channels
            filter_dim,         // filter_width
            filter_dim,         // filter_height
            num_filters,        // out_channels
            stride,             // skip_width
            stride,             // skip_height
            0,                  // max_pool
            weights_3,          // weights
            bias,               // bias
            PADDING_SAME_ZERO,  // pad
            RELU,               // activation
            0,                  // deconvolve
            0,                  // branch
            BRANCH_NO_COPY,     // branch_copy_type
            BRANCH_NOC,         // branch_combine_type
            {},                 // branch_config
            {},                 // bn_params
            2,                  // output_num
        },
        {
            num_filters,     // in_channels
            2 * filter_dim,  // filter_width
            2 * filter_dim,  // filter_height
            num_filters,     // out_channels
            2 * stride,      // skip_width
            2 * stride,      // skip_height
            0,               // max_pool
            weights_4,       // weights
            bias,            // bias
            PADDING_VALID,   // pad
            RELU,            // activation
            0,               // deconvolve
            1,               // branch
            BRANCH_NO_COPY,  // branch_copy_type
            BRANCH_CAT,      // branch_combine_type
            { 0, 0, 1 },     // branch_config
            {},              // bn_params
            3,               // output_num
        },
    },
  };

  CNN_THREAD_DATA thread_data = { 1, nullptr };

  const int num_outputs = 4;
  const int output_chs[4] = { filter_dim, filter_dim, filter_dim,
                              2 * filter_dim };
  const int output_dims[4] = { 4, 2, 1, 1 };
  const int output_sizes[4] = {
    output_chs[0] * output_dims[0] * output_dims[0],
    output_chs[1] * output_dims[1] * output_dims[1],
    output_chs[2] * output_dims[2] * output_dims[2],
    output_chs[3] * output_dims[3] * output_dims[3],
  };
  float *const output_ = (float *)aom_malloc(
      sizeof(*output_) *
      (output_sizes[0] + output_sizes[1] + output_sizes[2] + output_sizes[3]));
  ASSERT_NE(output_, nullptr);
  float *output[CNN_MAX_CHANNELS] = { nullptr };
  int ch_ite = 0;
  float *output_ite = output_;
  for (int output_idx = 0; output_idx < num_outputs; output_idx++) {
    for (int channel = 0; channel < output_chs[output_idx]; ++channel) {
      output[ch_ite++] = output_ite;
      output_ite += output_dims[output_idx] * output_dims[output_idx];
    }
  }
  CNN_MULTI_OUT output_struct = { num_outputs, output_chs, output_dims,
                                  output };

  RunMultiOutCNNTest(input, image_dim, image_dim, image_dim, &cnn_config,
                     &thread_data, &output_struct, expected, MSE_FLOAT_TOL);

  aom_free(output_);
}